

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error asmjit::Logging::formatOperand
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Operand_ *op)

{
  Error EVar1;
  Operand_ *in_stack_00000060;
  uint32_t in_stack_0000006c;
  CodeEmitter *in_stack_00000070;
  uint32_t in_stack_0000007c;
  StringBuilder *in_stack_00000080;
  
  EVar1 = X86Logging::formatOperand
                    (in_stack_00000080,in_stack_0000007c,in_stack_00000070,in_stack_0000006c,
                     in_stack_00000060);
  return EVar1;
}

Assistant:

Error Logging::formatOperand(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Operand_& op) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}